

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_sse2_128_64.c
# Opt level: O1

parasail_result_t *
parasail_sw_table_striped_profile_sse2_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ulong uVar1;
  long *plVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  int *piVar5;
  uint uVar6;
  bool bVar7;
  __m128i *palVar8;
  int iVar9;
  parasail_result_t *result;
  __m128i *b;
  __m128i *palVar10;
  __m128i *b_00;
  __m128i *palVar11;
  long lVar12;
  size_t len;
  ulong uVar13;
  undefined8 extraout_RDX;
  ulong uVar14;
  __m128i *ptr;
  uint uVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  int iVar21;
  ulong size;
  long lVar22;
  long lVar23;
  bool bVar24;
  ulong uVar25;
  __m128i_64_t B_2;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  long lVar28;
  __m128i_64_t B;
  long lVar30;
  long lVar31;
  undefined1 auVar29 [16];
  long lVar32;
  long lVar33;
  long lVar35;
  undefined1 auVar34 [16];
  long lVar37;
  __m128i c;
  __m128i c_00;
  int32_t column_len;
  long local_d8;
  __m128i *local_d0;
  ulong uStack_50;
  ulong uStack_40;
  longlong extraout_RDX_00;
  longlong lVar36;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_table_striped_profile_sse2_128_64_cold_8();
  }
  else {
    pvVar3 = (profile->profile64).score;
    if (pvVar3 == (void *)0x0) {
      parasail_sw_table_striped_profile_sse2_128_64_cold_7();
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_sw_table_striped_profile_sse2_128_64_cold_6();
      }
      else {
        uVar15 = profile->s1Len;
        if ((int)uVar15 < 1) {
          parasail_sw_table_striped_profile_sse2_128_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_table_striped_profile_sse2_128_64_cold_4();
        }
        else {
          uVar13 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_sw_table_striped_profile_sse2_128_64_cold_3();
          }
          else if (open < 0) {
            parasail_sw_table_striped_profile_sse2_128_64_cold_2();
          }
          else if (gap < 0) {
            parasail_sw_table_striped_profile_sse2_128_64_cold_1();
          }
          else {
            uVar1 = (ulong)uVar15 + 1;
            iVar21 = ppVar4->max;
            result = parasail_result_new_table1((uint)uVar1 & 0x7ffffffe,s2Len);
            if (result != (parasail_result_t *)0x0) {
              size = uVar1 >> 1;
              result->flag = result->flag | 0x2820804;
              b = parasail_memalign___m128i(0x10,size);
              palVar10 = parasail_memalign___m128i(0x10,size);
              local_d0 = parasail_memalign___m128i(0x10,size);
              b_00 = parasail_memalign___m128i(0x10,size);
              c[1]._1_7_ = (undefined7)((ulong)extraout_RDX >> 8);
              c[1]._0_1_ = (b_00 == (__m128i *)0x0 || local_d0 == (__m128i *)0x0) ||
                           (palVar10 == (__m128i *)0x0 || b == (__m128i *)0x0);
              if ((b_00 != (__m128i *)0x0 && local_d0 != (__m128i *)0x0) &&
                  (palVar10 != (__m128i *)0x0 && b != (__m128i *)0x0)) {
                len = 0x7fffffffffffffff;
                uVar25 = (ulong)(uint)gap;
                c[0] = size;
                parasail_memset___m128i(b,c,0x7fffffffffffffff);
                c_00[1] = extraout_RDX_00;
                c_00[0] = size;
                parasail_memset___m128i(b_00,c_00,len);
                uStack_50 = (ulong)(uint)gap;
                uStack_40 = (ulong)(uint)open;
                uVar18 = 0;
                uVar6 = (uint)size;
                lVar16 = size * uVar13 * 4;
                local_d8 = -0x4000000000000000;
                lVar22 = 0;
                uVar20 = 0;
                auVar26 = _DAT_008d0d00;
                auVar27 = _DAT_008d0d00;
                do {
                  ptr = b;
                  iVar17 = ppVar4->mapper[(byte)s2[uVar20]];
                  palVar11 = local_d0;
                  b = palVar10;
                  if ((int)uVar18 == (int)uVar20 + -2) {
                    palVar11 = palVar10;
                    b = local_d0;
                  }
                  lVar36 = ptr[uVar6 - 1][0];
                  lVar32 = 0;
                  lVar19 = 0;
                  lVar31 = 0;
                  lVar12 = 0;
                  lVar23 = lVar22;
                  do {
                    plVar2 = (long *)((long)pvVar3 + lVar19 + (long)iVar17 * (long)(int)uVar6 * 0x10
                                     );
                    lVar32 = lVar32 + *plVar2;
                    lVar35 = lVar36 + plVar2[1];
                    lVar33 = *(long *)((long)*b_00 + lVar19);
                    if (lVar33 < lVar32) {
                      lVar33 = lVar32;
                    }
                    lVar32 = *(long *)((long)*b_00 + lVar19 + 8);
                    if (lVar32 < lVar35) {
                      lVar32 = lVar35;
                    }
                    if (lVar33 <= lVar31) {
                      lVar33 = lVar31;
                    }
                    if (lVar32 <= lVar12) {
                      lVar32 = lVar12;
                    }
                    if (lVar33 < 1) {
                      lVar33 = 0;
                    }
                    if (lVar32 < 1) {
                      lVar32 = 0;
                    }
                    plVar2 = (long *)((long)*b_00 + lVar19);
                    lVar35 = *plVar2;
                    lVar37 = plVar2[1];
                    plVar2 = (long *)((long)*b + lVar19);
                    *plVar2 = lVar33;
                    plVar2[1] = lVar32;
                    piVar5 = ((result->field_4).rowcols)->score_row;
                    *(int *)((long)piVar5 + lVar23) = (int)lVar33;
                    *(int *)((long)piVar5 + lVar16 + lVar23) = (int)lVar32;
                    lVar28 = lVar33;
                    if (lVar33 <= auVar27._0_8_) {
                      lVar28 = auVar27._0_8_;
                    }
                    lVar30 = lVar32;
                    if (lVar32 <= auVar27._8_8_) {
                      lVar30 = auVar27._8_8_;
                    }
                    lVar33 = lVar33 - (ulong)(uint)open;
                    lVar32 = lVar32 - uStack_40;
                    lVar35 = lVar35 - uVar25;
                    lVar37 = lVar37 - uStack_50;
                    if (lVar35 <= lVar33) {
                      lVar35 = lVar33;
                    }
                    if (lVar37 <= lVar32) {
                      lVar37 = lVar32;
                    }
                    auVar27._8_8_ = lVar30;
                    auVar27._0_8_ = lVar28;
                    lVar28 = lVar31 - uVar25;
                    lVar30 = lVar12 - uStack_50;
                    lVar31 = lVar33;
                    if (lVar33 < lVar28) {
                      lVar31 = lVar28;
                    }
                    lVar12 = lVar32;
                    if (lVar32 < lVar30) {
                      lVar12 = lVar30;
                    }
                    plVar2 = (long *)((long)*b_00 + lVar19);
                    *plVar2 = lVar35;
                    plVar2[1] = lVar37;
                    plVar2 = (long *)((long)*ptr + lVar19);
                    lVar32 = *plVar2;
                    lVar36 = plVar2[1];
                    lVar19 = lVar19 + 0x10;
                    lVar23 = lVar23 + uVar13 * 4;
                  } while (size << 4 != lVar19);
                  iVar17 = 0;
                  do {
                    lVar23 = 0;
                    lVar12 = 0;
                    lVar32 = lVar22;
                    do {
                      lVar19 = *(long *)((long)*b + lVar12);
                      lVar33 = lVar23;
                      if (lVar23 < lVar19) {
                        lVar33 = lVar19;
                      }
                      lVar19 = *(long *)((long)*b + lVar12 + 8);
                      lVar35 = lVar31;
                      if (lVar31 < lVar19) {
                        lVar35 = lVar19;
                      }
                      plVar2 = (long *)((long)*b + lVar12);
                      *plVar2 = lVar33;
                      plVar2[1] = lVar35;
                      piVar5 = ((result->field_4).rowcols)->score_row;
                      *(int *)((long)piVar5 + lVar32) = (int)lVar33;
                      *(int *)((long)piVar5 + lVar16 + lVar32) = (int)lVar35;
                      lVar19 = lVar33;
                      if (lVar33 <= auVar27._0_8_) {
                        lVar19 = auVar27._0_8_;
                      }
                      lVar37 = lVar35;
                      if (lVar35 <= auVar27._8_8_) {
                        lVar37 = auVar27._8_8_;
                      }
                      auVar27._8_8_ = lVar37;
                      auVar27._0_8_ = lVar19;
                      lVar23 = lVar23 - uVar25;
                      lVar31 = lVar31 - uStack_50;
                      uVar14 = -(ulong)((long)(lVar35 - uStack_40) < lVar31);
                      auVar34._8_8_ = uVar14;
                      auVar34._0_8_ = -(ulong)((long)(lVar33 - (ulong)(uint)open) < lVar23);
                      if ((((((((((((((((auVar34 >> 7 & (undefined1  [16])0x1) ==
                                        (undefined1  [16])0x0 &&
                                       (auVar34 >> 0xf & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                      (auVar34 >> 0x17 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                     (auVar34 >> 0x1f & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar34 >> 0x27 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar34 >> 0x2f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar34 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar34 >> 0x3f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) && (uVar14 >> 7 & 1) == 0) &&
                               (uVar14 >> 0xf & 1) == 0) && (uVar14 >> 0x17 & 1) == 0) &&
                             (uVar14 >> 0x1f & 1) == 0) && (uVar14 >> 0x27 & 1) == 0) &&
                           (uVar14 >> 0x2f & 1) == 0) && (uVar14 >> 0x37 & 1) == 0) &&
                          -1 < (long)uVar14) goto LAB_005b44dc;
                      lVar12 = lVar12 + 0x10;
                      lVar32 = lVar32 + uVar13 * 4;
                    } while (size << 4 != lVar12);
                    bVar24 = iVar17 == 0;
                    iVar17 = iVar17 + 1;
                    lVar31 = lVar23;
                  } while (bVar24);
LAB_005b44dc:
                  bVar24 = auVar26._8_8_ < lVar37;
                  uVar14 = -(ulong)bVar24;
                  auVar29._8_8_ = uVar14;
                  auVar29._0_8_ = -(ulong)(auVar26._0_8_ < lVar19);
                  bVar7 = true;
                  if ((((((((((((((((auVar29 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                   || (auVar29 >> 0xf & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) ||
                                  (auVar29 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar29 >> 0x1f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar29 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar29 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar29 >> 0x37 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar29 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (uVar14 >> 7 & 1) != 0) || (uVar14 >> 0xf & 1) != 0) ||
                          (uVar14 >> 0x17 & 1) != 0) || (uVar14 >> 0x1f & 1) != 0) ||
                        (uVar14 >> 0x27 & 1) != 0) || (uVar14 >> 0x2f & 1) != 0) ||
                      (uVar14 >> 0x37 & 1) != 0) || bVar24) {
                    local_d8 = lVar37;
                    if (lVar37 < lVar19) {
                      local_d8 = lVar19;
                    }
                    if ((long)(~(long)iVar21 + 0x7fffffffffffffffU) < local_d8) {
                      *(byte *)&result->flag = (byte)result->flag | 0x40;
                      bVar7 = false;
                    }
                    else {
                      auVar26._8_4_ = (int)local_d8;
                      auVar26._0_8_ = local_d8;
                      auVar26._12_4_ = (int)((ulong)local_d8 >> 0x20);
                      uVar18 = uVar20 & 0xffffffff;
                    }
                  }
                  iVar17 = (int)uVar20;
                  if (!bVar7) break;
                  uVar20 = uVar20 + 1;
                  lVar22 = lVar22 + 4;
                  palVar10 = ptr;
                  iVar17 = s2Len;
                  local_d0 = palVar11;
                } while (uVar20 != uVar13);
                iVar21 = (int)uVar18;
                if (local_d8 == 0x7fffffffffffffff) {
                  *(byte *)&result->flag = (byte)result->flag | 0x40;
                }
                iVar9 = parasail_result_is_saturated(result);
                palVar10 = palVar11;
                if (iVar9 == 0) {
                  palVar8 = ptr;
                  if (iVar21 == iVar17 + -2) {
                    palVar10 = ptr;
                    palVar8 = palVar11;
                  }
                  if (iVar21 == iVar17 + -1) {
                    palVar10 = b;
                    b = palVar11;
                    palVar8 = ptr;
                  }
                  ptr = palVar8;
                  iVar17 = uVar15 - 1;
                  if ((uVar1 & 0x7ffffffe) != 0) {
                    uVar13 = 0;
                    do {
                      if ((*palVar10)[uVar13] == local_d8) {
                        uVar15 = 0;
                        if ((uVar13 & 1) != 0) {
                          uVar15 = uVar6;
                        }
                        iVar9 = uVar15 + ((uint)(uVar13 >> 1) & 0x7fffffff);
                        if (iVar9 < iVar17) {
                          iVar17 = iVar9;
                        }
                      }
                      uVar13 = uVar13 + 1;
                    } while ((uVar6 & 0x3fffffff) * 2 != (int)uVar13);
                  }
                  iVar9 = (int)local_d8;
                }
                else {
                  iVar21 = 0;
                  iVar9 = -1;
                  iVar17 = 0;
                }
                result->score = iVar9;
                result->end_query = iVar17;
                result->end_ref = iVar21;
                parasail_free(b_00);
                parasail_free(palVar10);
                parasail_free(ptr);
                parasail_free(b);
                return result;
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvE = NULL;
    __m128i vGapO;
    __m128i vGapE;
    __m128i vZero;
    __m128i vNegInf;
    int64_t score = 0;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    int64_t maxp = 0;
    /*int64_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m128i*)profile->profile64.score;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    vZero = _mm_setzero_si128();
    vNegInf = _mm_set1_epi64x_rpl(NEG_INF);
    score = NEG_INF;
    vMaxH = vNegInf;
    vMaxHUnit = vNegInf;
    maxp = INT64_MAX - (int64_t)(matrix->max+1);
    /*stop = profile->stop == INT32_MAX ?  INT64_MAX : (int64_t)profile->stop;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvHMax = parasail_memalign___m128i(16, segLen);
    pvE = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m128i(pvHStore, vZero, segLen);
    parasail_memset___m128i(pvE, _mm_set1_epi64x_rpl(-open), segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vF;
        __m128i vH;
        const __m128i* vP = NULL;
        __m128i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = vZero;

        /* load final segment of pvHStore and shift left by 8 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 8);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_add_epi64(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi64_rpl(vH, vE);
            vH = _mm_max_epi64_rpl(vH, vF);
            vH = _mm_max_epi64_rpl(vH, vZero);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm_max_epi64_rpl(vH, vMaxH);

            /* Update vE value. */
            vH = _mm_sub_epi64(vH, vGapO);
            vE = _mm_sub_epi64(vE, vGapE);
            vE = _mm_max_epi64_rpl(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_sub_epi64(vF, vGapE);
            vF = _mm_max_epi64_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm_slli_si128(vF, 8);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi64_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vMaxH = _mm_max_epi64_rpl(vH, vMaxH);
                vH = _mm_sub_epi64(vH, vGapO);
                vF = _mm_sub_epi64(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi64_rpl(vF, vH))) goto end;
                /*vF = _mm_max_epi64_rpl(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
        }
#endif

        {
            __m128i vCompare = _mm_cmpgt_epi64_rpl(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi64_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm_set1_epi64x_rpl(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    if (score == INT64_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT64_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m128i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m128i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int64_t *t = (int64_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}